

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lh_record_insert(unqlite_kv_engine *pKv,void *pKey,sxu32 nKeyLen,void *pData,
                    unqlite_int64 nDataLen,int is_append)

{
  void *pvVar1;
  sxu16 iOfft;
  ushort uVar2;
  sxu32 sVar3;
  lhash_kv_engine *plVar4;
  unqlite_page *puVar5;
  lhpage *pPage_00;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  lhash_bmap_rec *plVar12;
  lhcell *plVar13;
  lhpage *plVar14;
  lhcell *plVar15;
  unqlite_kv_io *puVar16;
  uchar *puVar17;
  uchar *puVar18;
  SyMemBackend *pDest;
  pgno pVar19;
  sxu64 sVar20;
  uchar *puVar21;
  unqlite_page *puVar22;
  ulong uVar23;
  uchar *puVar24;
  void *pvVar25;
  unqlite_page *pNew;
  void *local_d0;
  sxu16 local_c2;
  unqlite_page *pRaw;
  void *local_b8;
  ulong uStack_b0;
  uint local_a8;
  uchar *local_a0;
  sxu64 local_98;
  lhpage *local_90;
  lhpage *pPage;
  lhpage *pOld;
  lhpage *local_78;
  lhcell *local_70;
  pgno iOvfl_1;
  int local_5c;
  lhash_kv_engine *local_58;
  pgno local_50;
  pgno local_48;
  sxu64 local_40;
  pgno local_38;
  
  uVar23 = nDataLen;
  local_d0 = pData;
  iVar6 = (*pKv->pIo->xGet)(pKv->pIo->pHandle,1,(unqlite_page **)(pKv + 0x1a));
  if (iVar6 != 0) {
    return iVar6;
  }
  local_a0 = (uchar *)CONCAT44(local_a0._4_4_,nKeyLen);
  local_90 = (lhpage *)pKey;
  uVar7 = (*(code *)pKv[0x18].pIo)(pKey,nKeyLen);
  iVar6 = 0;
  local_98 = nDataLen;
  local_5c = is_append;
  local_58 = (lhash_kv_engine *)pKv;
  do {
    plVar4 = local_58;
    iVar8 = (int)uVar23;
    uVar11 = (ulong)((int)local_58->nmax_split_nucket - 1U & uVar7);
    uVar23 = (ulong)((int)local_58->max_split_bucket - 1U & uVar7);
    if (uVar11 < local_58->split_bucket + local_58->max_split_bucket) {
      uVar23 = uVar11;
    }
    plVar12 = lhMapFindBucket(local_58,uVar23);
    if (plVar12 == (lhash_bmap_rec *)0x0) {
      iVar6 = lhAcquirePage(plVar4,&pRaw);
      puVar22 = pRaw;
      if (iVar6 != 0) {
        return iVar6;
      }
      pPage = lhNewPage(plVar4,pRaw,(lhpage *)0x0);
      if (pPage == (lhpage *)0x0) {
        return -1;
      }
      iVar8 = lhSetEmptyPage(pPage);
      if (iVar8 == 0) {
        iVar8 = lhStoreCell(pPage,local_90,(sxu32)local_a0,local_d0,nDataLen,uVar7,1);
        if (iVar8 == 0) {
          iVar8 = lhMapWriteRecord(plVar4,uVar23,puVar22->iPage);
        }
      }
      puVar16 = plVar4->pIo;
      goto LAB_00111e40;
    }
    iVar8 = lhLoadPage(plVar4,plVar12->iReal,(lhpage *)0x0,&pPage,iVar8);
    if (iVar8 != 0) {
      return iVar8;
    }
    (*plVar4->pIo->xDontMkHot)(pPage->pRaw);
    plVar14 = local_90;
    sVar3 = (sxu32)local_a0;
    plVar13 = lhFindCell(pPage,local_90,(sxu32)local_a0,uVar7);
    pPage_00 = pPage;
    if (plVar13 != (lhcell *)0x0) {
      plVar14 = plVar13->pPage;
      plVar4 = plVar14->pHash;
      if (local_5c == 0) {
        iVar8 = (*plVar4->pIo->xWrite)(plVar14->pRaw);
        if (iVar8 != 0) goto LAB_00111e2c;
        if (plVar13->iOvfl != 0) {
          iVar8 = (*plVar4->pIo->xGet)(plVar4->pIo->pHandle,plVar13->iDataPage,&pRaw);
          puVar22 = pRaw;
          if (iVar8 == 0) {
            SyBigEndianUnpack64(pRaw->zData,&iOvfl_1);
            pNew = puVar22;
            while ((iOvfl_1 != 0 &&
                   (iVar6 = (*plVar4->pIo->xGet)(plVar4->pIo->pHandle,iOvfl_1,&pNew), puVar5 = pRaw,
                   puVar22 = pNew, iVar6 == 0))) {
              SyBigEndianUnpack64(pNew->zData,&iOvfl_1);
              if (puVar22 != puVar5) {
                lhRestorePage(plVar4,puVar22);
                (*plVar4->pIo->xPageUnref)(pNew);
              }
            }
            puVar21 = pRaw->zData;
            uVar2 = plVar13->iDataOfft;
            iVar6 = plVar4->iPageSize;
            iVar8 = (*plVar4->pIo->xWrite)(pRaw);
            if (iVar8 == 0) {
              pvVar1 = (void *)(local_98 + (long)local_d0);
              local_a0 = puVar21 + iVar6;
              pDest = (SyMemBackend *)(puVar21 + uVar2);
              puVar21 = pRaw->zData;
              puVar21[0] = '\0';
              puVar21[1] = '\0';
              puVar21[2] = '\0';
              puVar21[3] = '\0';
              puVar21[4] = '\0';
              puVar21[5] = '\0';
              puVar21[6] = '\0';
              puVar21[7] = '\0';
              local_90 = plVar14;
              for (pvVar25 = local_d0; pvVar25 < pvVar1;
                  pvVar25 = (void *)((long)pvVar25 + (ulong)uVar7)) {
                if (local_a0 <= pDest) {
                  iVar8 = lhAcquirePage(plVar4,(unqlite_page **)&pOld);
                  plVar14 = pOld;
                  if ((iVar8 != 0) ||
                     (iVar8 = (*plVar4->pIo->xWrite)((unqlite_page *)pOld), iVar8 != 0))
                  goto LAB_00111e2c;
                  sVar20._0_2_ = (plVar14->sHdr).iOfft;
                  sVar20._2_2_ = (plVar14->sHdr).iFree;
                  sVar20._4_4_ = *(undefined4 *)&(plVar14->sHdr).field_0x4;
                  SyBigEndianPack64(pRaw->zData,sVar20);
                  (*plVar4->pIo->xPageUnref)(pRaw);
                  plVar14->pHash->pIo = (unqlite_kv_io *)0x0;
                  pRaw = (unqlite_page *)plVar14;
                  pDest = &plVar14->pHash->sAllocator;
                  local_a0 = (uchar *)((long)(plVar14->pHash->sAllocator).apPool +
                                      (long)plVar4->iPageSize + -0x48);
                }
                uVar10 = (int)local_a0 - (int)pDest;
                uVar7 = (int)pvVar1 - (int)pvVar25;
                if (uVar10 <= uVar7) {
                  uVar7 = uVar10;
                }
                SyMemcpy(pvVar25,pDest,uVar7);
                pDest = (SyMemBackend *)((long)pDest->apPool + ((ulong)uVar7 - 0x40));
              }
              (*plVar4->pIo->xPageUnref)(pRaw);
              plVar13->nData = local_98;
              puVar21 = local_90->pRaw->zData;
              uVar2 = plVar13->iStart;
              sVar20 = local_98;
              goto LAB_00112490;
            }
          }
          goto LAB_00111e2c;
        }
        puVar21 = plVar14->pRaw->zData + (plVar13->nKey + (uint)plVar13->iStart + 0x1a);
        if (plVar13->nData == nDataLen) {
          SyMemcpy(local_d0,puVar21,(sxu32)nDataLen);
          goto LAB_001124e0;
        }
        if ((ulong)nDataLen < plVar13->nData) {
          SyMemcpy(local_d0,puVar21,(sxu32)nDataLen);
          SyBigEndianPack64(plVar14->pRaw->zData + (ulong)plVar13->iStart + 8,nDataLen);
          lhRestoreSpace(plVar14,(short)*(undefined4 *)&plVar13->iStart + (short)plVar13->nKey +
                                 (short)nDataLen + 0x1a,(short)(int)plVar13->nData - (short)nDataLen
                        );
          plVar13->nData = nDataLen;
          goto LAB_001124e0;
        }
        pRaw = (unqlite_page *)((ulong)pRaw & 0xffffffffffff0000);
        iVar6 = lhAllocateSpace(plVar14,(ulong)(plVar13->nKey + 0x1a) + nDataLen,(sxu16 *)&pRaw);
        if (iVar6 == 0) {
          iOfft = plVar13->iStart;
          sVar20 = plVar13->nData;
          lhMoveLocalCell(plVar13,(sxu16)pRaw,local_d0,nDataLen);
          lhRestoreSpace(plVar14,iOfft,(short)plVar13->nKey + (short)(int)sVar20 + 0x1a);
        }
        else {
          iVar8 = lhCellWriteOvflPayload
                            (plVar13,plVar14->pRaw->zData + (ulong)plVar13->iStart + 0x1a,
                             plVar13->nKey,local_d0,nDataLen,0);
          if (iVar8 != 0) goto LAB_00111e2c;
          SyBigEndianPack64(plVar14->pRaw->zData + (ulong)plVar13->iStart + 8,nDataLen);
          lhRestoreSpace(plVar14,(short)*(undefined4 *)&plVar13->iStart + 0x1a,
                         (short)(int)plVar13->nData + (short)plVar13->nKey);
          plVar13->nData = nDataLen;
        }
        goto LAB_001124e0;
      }
      puVar16 = plVar4->pIo;
      if (CARRY8(plVar13->nData,nDataLen)) {
        (*puVar16->xErr)(puVar16->pHandle,"Append operation will cause data overflow");
        iVar8 = -7;
        goto LAB_00111e2c;
      }
      iVar8 = (*puVar16->xWrite)(plVar14->pRaw);
      if (iVar8 != 0) goto LAB_00111e2c;
      if (plVar13->iOvfl != 0) {
        iVar8 = (*plVar4->pIo->xGet)(plVar4->pIo->pHandle,plVar13->iDataPage,&pRaw);
        puVar22 = pRaw;
        if (iVar8 != 0) goto LAB_00111e2c;
        puVar18 = pRaw->zData;
        SyBigEndianUnpack64(puVar18,(sxu64 *)&pOld);
        puVar21 = puVar18 + plVar13->iDataOfft;
        puVar18 = puVar18 + plVar4->iPageSize;
        uVar7 = plVar4->iPageSize - (uint)plVar13->iDataOfft;
        puVar24 = (uchar *)plVar13->nData;
        goto LAB_00111eb6;
      }
      pNew = (unqlite_page *)((ulong)pNew & 0xffffffffffff0000);
      iVar6 = lhAllocateSpace(plVar14,plVar13->nData + nDataLen + (ulong)(plVar13->nKey + 0x1a),
                              (sxu16 *)&pNew);
      if (iVar6 != 0) {
        puVar21 = plVar14->pRaw->zData;
        iVar8 = lhCellWriteOvflPayload
                          (plVar13,puVar21 + (ulong)plVar13->iStart + 0x1a,plVar13->nKey,
                           puVar21 + (plVar13->iStart + 0x1a + plVar13->nKey),plVar13->nData,
                           local_d0,nDataLen,0);
        if (iVar8 != 0) goto LAB_00111e2c;
        SyBigEndianPack64(plVar14->pRaw->zData + (ulong)plVar13->iStart + 8,
                          plVar13->nData + nDataLen);
        lhRestoreSpace(plVar14,(short)*(undefined4 *)&plVar13->iStart + 0x1a,
                       (short)(int)plVar13->nData + (short)plVar13->nKey);
        plVar13->nData = plVar13->nData + nDataLen;
        goto LAB_001124e0;
      }
      uVar2 = plVar13->iStart;
      sVar3 = (sxu32)plVar13->nData;
      pRaw = (unqlite_page *)&plVar4->sAllocator;
      local_b8 = (void *)0x0;
      uStack_b0 = 0;
      local_a8 = 0;
      iVar8 = SyBlobAppend((SyBlob *)&pRaw,
                           plVar14->pRaw->zData + (plVar13->nKey + (uint)uVar2 + 0x1a),sVar3);
      if ((iVar8 == 0) &&
         (iVar8 = SyBlobAppend((SyBlob *)&pRaw,local_d0,(sxu32)local_98), iVar8 == 0)) {
        lhMoveLocalCell(plVar13,(sxu16)pNew,local_b8,uStack_b0 & 0xffffffff);
        lhRestoreSpace(plVar14,uVar2,(short)plVar13->nKey + (short)sVar3 + 0x1a);
        SyBlobRelease((SyBlob *)&pRaw);
        goto LAB_001124e0;
      }
      SyBlobRelease((SyBlob *)&pRaw);
      goto LAB_00111e2c;
    }
    uVar23 = nDataLen;
    iVar8 = lhStoreCell(pPage,plVar14,sVar3,local_d0,nDataLen,uVar7,0);
    if (iVar8 != -0x49) {
LAB_00111910:
      if (iVar8 == -0x21) goto LAB_0011191a;
      goto LAB_00111e2c;
    }
    plVar4 = pPage_00->pHash;
    plVar12 = lhMapFindBucket(plVar4,plVar4->split_bucket);
    iVar8 = -0x18;
    nDataLen = local_98;
    if (((plVar12 == (lhash_bmap_rec *)0x0) ||
        (iVar8 = lhLoadPage(plVar4,plVar12->iReal,(lhpage *)0x0,&pOld,(int)uVar23),
        nDataLen = local_98, iVar8 != 0)) ||
       (iVar8 = lhAcquirePage(plVar4,(unqlite_page **)&iOvfl_1), pVar19 = iOvfl_1,
       nDataLen = local_98, iVar8 != 0)) goto LAB_00111910;
    plVar14 = lhNewPage(plVar4,(unqlite_page *)iOvfl_1,(lhpage *)0x0);
    iVar8 = -1;
    nDataLen = local_98;
    if (plVar14 == (lhpage *)0x0) goto LAB_00111910;
    iVar8 = lhSetEmptyPage(plVar14);
    local_78 = plVar14;
    if ((iVar8 != 0) ||
       (iVar8 = lhMapWriteRecord(plVar4,plVar4->max_split_bucket + plVar4->split_bucket,
                                 *(pgno *)(pVar19 + 0x10)), iVar8 != 0)) {
LAB_0011198f:
      (*plVar4->pIo->xPageUnref)(local_78->pRaw);
      nDataLen = local_98;
      goto LAB_00111910;
    }
    local_48 = pPage_00->pRaw->iPage;
    local_50 = pOld->pRaw->iPage;
    local_38 = plVar4->split_bucket;
    local_40 = plVar4->nmax_split_nucket + 0xffffffff;
    pRaw = (unqlite_page *)&pOld->pHash->sAllocator;
    local_b8 = (void *)0x0;
    uStack_b0 = 0;
    local_a8 = 0;
    pVar19 = local_38;
    uVar23 = local_40;
    plVar13 = pOld->pList;
    while (plVar15 = plVar13, plVar14 = local_78, plVar15 != (lhcell *)0x0) {
      plVar13 = plVar15->pNext;
      if ((plVar15->nHash & (uint)uVar23) != pVar19) {
        local_70 = plVar15;
        if (plVar15->iOvfl == 0) {
          uStack_b0 = uStack_b0 & 0xffffffff00000000;
          if ((local_a8 & 4) != 0) {
            local_b8 = (void *)0x0;
            uStack_b0 = 0;
            local_a8 = local_a8 & 0xfffffffb;
          }
          if ((((plVar15->sKey).nByte == 0) &&
              (iVar8 = lhConsumeCellkey(plVar15,unqliteDataConsumer,&plVar15->sKey,0), iVar8 != 0))
             || (plVar15 = local_70, iVar8 = lhConsumeCellData(local_70,unqliteDataConsumer,&pRaw),
                iVar8 != 0)) goto LAB_00111bcf;
          uVar23 = uStack_b0 & 0xffffffff;
          iVar8 = lhStoreCell(local_78,(plVar15->sKey).pBlob,(plVar15->sKey).nByte,local_b8,uVar23,
                              plVar15->nHash,1);
        }
        else {
          pNew = (unqlite_page *)local_78;
          iVar8 = lhAllocateSpace(local_78,0x1a,&local_c2);
          if ((iVar8 == 0) ||
             (iVar8 = lhFindSlavePage(local_78,0x1a,&local_c2,(lhpage **)&pNew),
             plVar14 = (lhpage *)pNew, iVar8 == 0)) {
            plVar15 = lhNewCell(plVar14->pHash,plVar14);
            iVar8 = -1;
            if (plVar15 != (lhcell *)0x0) {
              plVar15->iStart = local_c2;
              plVar15->nData = local_70->nData;
              plVar15->nKey = local_70->nKey;
              plVar15->iOvfl = local_70->iOvfl;
              plVar15->iDataOfft = local_70->iDataOfft;
              plVar15->iDataPage = local_70->iDataPage;
              plVar15->nHash = local_70->nHash;
              SyBlobDup(&local_70->sKey,&plVar15->sKey);
              iVar9 = lhInstallCell(plVar15);
              iVar8 = -1;
              if (iVar9 == 0) {
                lhCellWriteHeader(plVar15);
                iVar8 = 0;
              }
            }
          }
        }
        if (iVar8 != 0) goto LAB_00111bcf;
        lhUnlinkCell(local_70);
        pVar19 = local_38;
        uVar23 = local_40;
      }
    }
    iVar8 = 0;
LAB_00111bcf:
    SyBlobRelease((SyBlob *)&pRaw);
    if (iVar8 != 0) goto LAB_0011198f;
    plVar4->split_bucket = plVar4->split_bucket + 1;
    iVar8 = (*plVar4->pIo->xWrite)(plVar4->pHeader);
    nDataLen = local_98;
    if (iVar8 != 0) goto LAB_00111910;
    uVar11 = plVar4->split_bucket;
    if (uVar11 < plVar4->max_split_bucket) {
      puVar21 = plVar4->pHeader->zData + 0x10;
    }
    else {
      plVar4->split_bucket = 0;
      plVar4->max_split_bucket = plVar4->nmax_split_nucket;
      pVar19 = plVar4->nmax_split_nucket * 2;
      plVar4->nmax_split_nucket = pVar19;
      if (pVar19 == 0) {
        (*plVar4->pIo->xErr)(plVar4->pIo->pHandle,"Database page (64-bit integer) limit reached");
        iVar8 = -7;
        nDataLen = local_98;
        goto LAB_00111910;
      }
      puVar21 = plVar4->pHeader->zData;
      puVar21[0x10] = '\0';
      puVar21[0x11] = '\0';
      puVar21[0x12] = '\0';
      puVar21[0x13] = '\0';
      puVar21[0x14] = '\0';
      puVar21[0x15] = '\0';
      puVar21[0x16] = '\0';
      puVar21[0x17] = '\0';
      uVar11 = plVar4->max_split_bucket;
      puVar21 = plVar4->pHeader->zData + 0x18;
    }
    SyBigEndianPack64(puVar21,uVar11);
    nDataLen = local_98;
    if (local_48 != local_50) {
      uVar23 = local_98;
      iVar8 = lhStoreCell(pPage_00,local_90,(sxu32)local_a0,local_d0,local_98,uVar7,1);
      goto LAB_00111910;
    }
LAB_0011191a:
    iVar6 = iVar6 + 1;
  } while (iVar6 != 3);
  iVar8 = -0x21;
  goto LAB_00111e2c;
LAB_00111eb6:
  if (puVar18 <= puVar21) {
    puVar16 = plVar4->pIo;
    if (pOld == (lhpage *)0x0) {
      (*puVar16->xErr)(puVar16->pHandle,"Corrupt overflow page");
      iVar8 = -0x18;
      goto LAB_00111e2c;
    }
    iVar8 = (*puVar16->xGet)(puVar16->pHandle,(pgno)pOld,&pNew);
    if (iVar8 != 0) goto LAB_00111e2c;
    SyBigEndianUnpack64(pNew->zData,(sxu64 *)&pOld);
    (*plVar4->pIo->xPageUnref)(pRaw);
    puVar21 = pNew->zData + 8;
    iVar6 = plVar13->pPage->pHash->iPageSize;
    puVar18 = pNew->zData + iVar6;
    uVar7 = iVar6 - 8;
    pRaw = pNew;
    puVar22 = pNew;
  }
  puVar17 = (uchar *)(ulong)uVar7;
  if (puVar24 < puVar17) goto LAB_0011226c;
  puVar21 = puVar21 + (long)puVar17;
  puVar24 = puVar24 + -(long)puVar17;
  goto LAB_00111eb6;
LAB_0011226c:
  local_a0 = puVar24;
  iVar8 = (*plVar4->pIo->xWrite)(puVar22);
  if (iVar8 == 0) {
    pvVar1 = (void *)((long)local_d0 + local_98);
    puVar21 = puVar21 + (long)local_a0;
    local_90 = plVar14;
    while (local_d0 < pvVar1) {
      if (puVar18 <= puVar21) {
        iVar8 = lhAcquirePage(plVar4,&pNew);
        if ((iVar8 != 0) || (iVar8 = (*plVar4->pIo->xWrite)(pNew), iVar8 != 0)) goto LAB_00111e2c;
        SyBigEndianPack64(pRaw->zData,pNew->iPage);
        (*plVar4->pIo->xPageUnref)(pRaw);
        puVar21 = pNew->zData;
        puVar21[0] = '\0';
        puVar21[1] = '\0';
        puVar21[2] = '\0';
        puVar21[3] = '\0';
        puVar21[4] = '\0';
        puVar21[5] = '\0';
        puVar21[6] = '\0';
        puVar21[7] = '\0';
        pRaw = pNew;
        puVar21 = pNew->zData + 8;
        puVar18 = pNew->zData + plVar4->iPageSize;
      }
      pvVar25 = local_d0;
      uVar10 = (int)puVar18 - (int)puVar21;
      uVar7 = (int)pvVar1 - (int)local_d0;
      if (uVar10 <= uVar7) {
        uVar7 = uVar10;
      }
      SyMemcpy(local_d0,puVar21,uVar7);
      puVar21 = puVar21 + uVar7;
      local_d0 = (void *)((long)pvVar25 + (ulong)uVar7);
    }
    (*plVar4->pIo->xPageUnref)(pRaw);
    sVar20 = local_98 + plVar13->nData;
    plVar13->nData = sVar20;
    puVar21 = local_90->pRaw->zData;
    uVar2 = plVar13->iStart;
LAB_00112490:
    SyBigEndianPack64(puVar21 + (ulong)uVar2 + 8,sVar20);
LAB_001124e0:
    iVar8 = 0;
  }
LAB_00111e2c:
  puVar16 = local_58->pIo;
  puVar22 = pPage->pRaw;
LAB_00111e40:
  (*puVar16->xPageUnref)(puVar22);
  return iVar8;
}

Assistant:

static int lh_record_insert(
	  unqlite_kv_engine *pKv,         /* KV store */
	  const void *pKey,sxu32 nKeyLen, /* Payload: Key */
	  const void *pData,unqlite_int64 nDataLen, /* Payload: data */
	  int is_append /* True for an append operation */
	  )
{
	lhash_kv_engine *pEngine = (lhash_kv_engine *)pKv;
	lhash_bmap_rec *pRec;
	unqlite_page *pRaw;
	lhpage *pPage;
	lhcell *pCell;
	pgno iBucket;
	sxu32 nHash;
	int iCnt;
	int rc;

	/* Acquire the first page (DB hash Header) so that everything gets loaded automatically */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iCnt = 0;
	/* Compute the hash of the key first */
	nHash = pEngine->xHash(pKey,(sxu32)nKeyLen);
retry:
	/* Extract the logical bucket number */
	iBucket = nHash & (pEngine->nmax_split_nucket - 1);
	if( iBucket >= pEngine->split_bucket + pEngine->max_split_bucket ){
		/* Low mask */
		iBucket = nHash & (pEngine->max_split_bucket - 1);
	}
	/* Map the logical bucket number to real page number */
	pRec = lhMapFindBucket(pEngine,iBucket);
	if( pRec == 0 ){
		/* Request a new page */
		rc = lhAcquirePage(pEngine,&pRaw);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initialize the page */
		pPage = lhNewPage(pEngine,pRaw,0);
		if( pPage == 0 ){
			return UNQLITE_NOMEM;
		}
		/* Mark as an empty page */
		rc = lhSetEmptyPage(pPage);
		if( rc != UNQLITE_OK ){
			pEngine->pIo->xPageUnref(pRaw); /* pPage will be released during this call */
			return rc;
		}
		/* Store the cell */
		rc = lhStoreCell(pPage,pKey,nKeyLen,pData,nDataLen,nHash,1);
		if( rc == UNQLITE_OK ){
			/* Install and write the logical map record */
			rc = lhMapWriteRecord(pEngine,iBucket,pRaw->iPage);
		}
		pEngine->pIo->xPageUnref(pRaw);
		return rc;
	}else{
		/* Load the page */
		rc = lhLoadPage(pEngine,pRec->iReal,0,&pPage,0);
		if( rc != UNQLITE_OK ){
			/* IO error, unlikely scenario */
			return rc;
		}
		/* Do not add this page to the hot dirty list */
		pEngine->pIo->xDontMkHot(pPage->pRaw);
		/* Lookup for the cell */
		pCell = lhFindCell(pPage,pKey,(sxu32)nKeyLen,nHash);
		if( pCell == 0 ){
			/* Create the record */
			rc = lhRecordInstall(pPage,nHash,pKey,nKeyLen,pData,nDataLen);
			if( rc == SXERR_RETRY && iCnt++ < 2 ){
				rc = UNQLITE_OK;
				goto retry;
			}
		}else{
			if( is_append ){
				/* Append operation */
				rc = lhRecordAppend(pCell,pData,nDataLen);
			}else{
				/* Overwrite old value */
				rc = lhRecordOverwrite(pCell,pData,nDataLen);
			}
		}
		pEngine->pIo->xPageUnref(pPage->pRaw);
	}
	return rc;
}